

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.hpp
# Opt level: O0

string * __thiscall OpenMD::EAM::getName_abi_cxx11_(EAM *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x100));
  return in_RDI;
}

Assistant:

virtual string getName() { return name_; }